

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::ChildPopper::visitDrop
          (Result<wasm::Ok> *__return_storage_ptr__,ChildPopper *this,Drop *curr,
          optional<unsigned_int> arity)

{
  ConstraintCollector local_60;
  undefined1 local_40 [8];
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  children;
  Drop *curr_local;
  ChildPopper *this_local;
  optional<unsigned_int> arity_local;
  
  children.
  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  std::
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::vector((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
            *)local_40);
  ConstraintCollector::ConstraintCollector
            (&local_60,this->builder,
             (vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
              *)local_40);
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitDrop
            (&local_60.super_ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>,
             (Drop *)children.
                     super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,arity);
  popConstrainedChildren
            (__return_storage_ptr__,this,
             (vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
              *)local_40);
  std::
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::~vector((vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<> visitDrop(Drop* curr, std::optional<Index> arity = std::nullopt) {
    std::vector<Child> children;
    ConstraintCollector{builder, children}.visitDrop(curr, arity);
    return popConstrainedChildren(children);
  }